

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O1

void __thiscall Js::WebAssemblyModule::SwapWasmFunctionInfo(WebAssemblyModule *this,uint i1,uint i2)

{
  WasmFunctionInfo *local_38;
  WasmFunctionInfo *f1;
  WasmFunctionInfo *f2;
  
  local_38 = GetWasmFunctionInfo(this,i1);
  f1 = GetWasmFunctionInfo(this,i2);
  JsUtil::
  List<Wasm::WasmFunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  SetItem((this->m_functionsInfo).ptr,i1,&f1);
  JsUtil::
  List<Wasm::WasmFunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  SetItem((this->m_functionsInfo).ptr,i2,&local_38);
  return;
}

Assistant:

void
WebAssemblyModule::SwapWasmFunctionInfo(uint i1, uint i2)
{
    Wasm::WasmFunctionInfo* f1 = GetWasmFunctionInfo(i1);
    Wasm::WasmFunctionInfo* f2 = GetWasmFunctionInfo(i2);
    m_functionsInfo->SetItem(i1, f2);
    m_functionsInfo->SetItem(i2, f1);
}